

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O0

XrResult LayerTestXrDestroyInstance(XrInstance instance)

{
  mapped_type *pp_Var1;
  XrResult local_1c;
  _func_void *p_Stack_18;
  XrResult res;
  PFN_xrVoidFunction nextDestroyInstance;
  XrInstance instance_local;
  
  p_Stack_18 = (_func_void *)0x0;
  nextDestroyInstance = (PFN_xrVoidFunction)instance;
  pp_Var1 = std::
            map<XrInstance_T_*,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)()),_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
            ::operator[](&g_next_gipa_map,(key_type *)&nextDestroyInstance);
  local_1c = (**pp_Var1)((XrInstance_T *)nextDestroyInstance,"xrDestroyInstance",
                         &stack0xffffffffffffffe8);
  if (XR_ERROR_VALIDATION_FAILURE < local_1c) {
    local_1c = (*p_Stack_18)(nextDestroyInstance);
  }
  if (XR_ERROR_VALIDATION_FAILURE < local_1c) {
    std::
    map<XrInstance_T_*,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)()),_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
    ::erase(&g_next_gipa_map,(key_type *)&nextDestroyInstance);
  }
  return local_1c;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL LayerTestXrDestroyInstance(XrInstance instance) {
    // Call down to the next xrDestroyInstance.
    PFN_xrVoidFunction nextDestroyInstance{nullptr};
    XrResult res = g_next_gipa_map[instance](instance, "xrDestroyInstance", &nextDestroyInstance);
    if (XR_SUCCEEDED(res)) {
        res = reinterpret_cast<PFN_xrDestroyInstance>(nextDestroyInstance)(instance);
    }

    if (XR_SUCCEEDED(res)) {
        g_next_gipa_map.erase(instance);
    }

    return res;
}